

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

bool __thiscall PDA::Transducer::StoreFst::step(StoreFst *this)

{
  wchar_t wVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  wchar_t *pwVar5;
  Settings *pSVar6;
  wostream *pwVar7;
  vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_> *pvVar8;
  reference pvVar9;
  wstring *pwVar10;
  reference pvVar11;
  allocator<wchar_t> local_a9;
  wstring local_a8 [36];
  int local_84;
  int local_80;
  byte local_7a;
  allocator<wchar_t> local_79;
  wstring local_78 [32];
  int local_58;
  allocator<wchar_t> local_41;
  wstring local_40 [36];
  int local_1c;
  StoreFst *local_18;
  StoreFst *this_local;
  
  iVar3 = (this->m_currentState).m_sourcePosition;
  local_18 = this;
  sVar4 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::size
                    (&this->m_tokens);
  if (iVar3 < (int)sVar4) {
    bVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::empty(&(this->m_currentState).m_stack);
    if (bVar2) {
      rollback(this);
    }
    else {
      bVar2 = isTerminalOnTop(this);
      if (bVar2) {
        pwVar5 = std::vector<wchar_t,_std::allocator<wchar_t>_>::back
                           (&(this->m_currentState).m_stack);
        wVar1 = *pwVar5;
        pvVar11 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
                  operator[](&this->m_tokens,(long)(this->m_currentState).m_sourcePosition);
        if (wVar1 == pvVar11->token) {
          (this->m_currentState).m_sourcePosition = (this->m_currentState).m_sourcePosition + 1;
          std::vector<wchar_t,_std::allocator<wchar_t>_>::pop_back(&(this->m_currentState).m_stack);
        }
        else {
          rollback(this);
        }
      }
      else {
        if ((this->m_currentState).m_ruleIndex == -1) {
          pwVar5 = std::vector<wchar_t,_std::allocator<wchar_t>_>::back
                             (&(this->m_currentState).m_stack);
          iVar3 = findRule(this,*pwVar5);
          (this->m_currentState).m_ruleIndex = iVar3;
          (this->m_currentState).m_chainIndex = -1;
        }
        if ((this->m_currentState).m_ruleIndex == -1) {
          pSVar6 = Utils::Settings::Instance();
          bVar2 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
          if (bVar2) {
            local_1c = (int)std::setw(10);
            pwVar7 = std::operator<<((wostream *)&std::wcerr,(_Setw)local_1c);
            pwVar7 = std::operator<<(pwVar7,L"Error: no rule found(");
            pwVar5 = std::vector<wchar_t,_std::allocator<wchar_t>_>::back
                               (&(this->m_currentState).m_stack);
            pwVar7 = std::operator<<(pwVar7,*pwVar5);
            pwVar7 = std::operator<<(pwVar7,L')');
            std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
          }
          std::allocator<wchar_t>::allocator();
          std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                    (local_40,L"Grammar error, no rule",&local_41);
          raise(this,(int)local_40);
        }
        pSVar6 = Utils::Settings::Instance();
        bVar2 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
        if (bVar2) {
          local_58 = (int)std::setw(10);
          pwVar7 = std::operator<<((wostream *)&std::wcout,(_Setw)local_58);
          pwVar7 = std::operator<<(pwVar7,L"NT ");
          pwVar5 = std::vector<wchar_t,_std::allocator<wchar_t>_>::back
                             (&(this->m_currentState).m_stack);
          pwVar7 = std::operator<<(pwVar7,*pwVar5);
          pwVar7 = std::operator<<(pwVar7,L"[");
          pwVar7 = (wostream *)
                   std::wostream::operator<<(pwVar7,(this->m_currentState).m_chainIndex + 1);
          pwVar7 = std::operator<<(pwVar7,L"]-> ");
          iVar3 = (this->m_currentState).m_chainIndex;
          pvVar8 = Grammar::rules(&this->m_grammar);
          pvVar9 = std::
                   vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
                   ::operator[](pvVar8,(long)(this->m_currentState).m_ruleIndex);
          sVar4 = std::
                  vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                  ::size(&pvVar9->m_chains);
          local_7a = 0;
          if (iVar3 + 1 < (int)sVar4) {
            pvVar8 = Grammar::rules(&this->m_grammar);
            pvVar9 = std::
                     vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
                     ::operator[](pvVar8,(long)(this->m_currentState).m_ruleIndex);
            pwVar10 = (wstring *)
                      std::
                      vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                      ::operator[](&pvVar9->m_chains,(long)((this->m_currentState).m_chainIndex + 1)
                                  );
            std::__cxx11::wstring::wstring(local_78,pwVar10);
          }
          else {
            std::allocator<wchar_t>::allocator();
            local_7a = 1;
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_78,L"<EMPTY>",&local_79);
          }
          pwVar7 = std::operator<<(pwVar7,local_78);
          std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
          std::__cxx11::wstring::~wstring(local_78);
          if ((local_7a & 1) != 0) {
            std::allocator<wchar_t>::~allocator(&local_79);
          }
        }
        std::
        stack<PDA::Transducer::StoreFst::State,_std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>_>
        ::push(&this->m_states,&this->m_currentState);
        expandCurrentNTerminal(this);
      }
    }
  }
  else {
    pSVar6 = Utils::Settings::Instance();
    bVar2 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
    if (bVar2) {
      local_80 = (int)std::setw(10);
      pwVar7 = std::operator<<((wostream *)&std::wcout,(_Setw)local_80);
      pwVar7 = std::operator<<(pwVar7,L"Source empty");
      std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    bVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::empty(&(this->m_currentState).m_stack);
    if (bVar2) {
      pSVar6 = Utils::Settings::Instance();
      bVar2 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
      if (bVar2) {
        local_84 = (int)std::setw(10);
        pwVar7 = std::operator<<((wostream *)&std::wcout,(_Setw)local_84);
        pwVar7 = std::operator<<(pwVar7,L"Parsing complete");
        std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
      }
      return false;
    }
    bVar2 = std::
            stack<PDA::Transducer::StoreFst::State,_std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>_>
            ::empty(&this->m_states);
    if (bVar2) {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_a8,L"mismatch",&local_a9);
      raise(this,(int)local_a8);
    }
    rollback(this);
  }
  debugLine(this);
  return true;
}

Assistant:

bool step()
    {
        if (m_currentState.m_sourcePosition < static_cast<int>(m_tokens.size()))
        {
            if (!m_currentState.m_stack.empty())
            {
                if (!isTerminalOnTop())
                {
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        m_currentState.m_ruleIndex = findRule(m_currentState.m_stack.back());
                        m_currentState.m_chainIndex = -1;
                    }
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                            std::wcerr << std::setw(10) << L"Error: no rule found(" << m_currentState.m_stack.back() << L')' << std::endl;
                        raise(L"Grammar error, no rule");
                    }
                    if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                        std::wcout << std::setw(10) << L"NT " << m_currentState.m_stack.back() << L"[" << m_currentState.m_chainIndex + 1 << L"]-> "
                                   << ((m_currentState.m_chainIndex + 1 < static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size())) ?
                                    m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex + 1)].m_chain : L"<EMPTY>") << std::endl;

                    m_states.push(m_currentState);
                    expandCurrentNTerminal();
                }
                else
                {
                    if (m_currentState.m_stack.back() == m_tokens[static_cast<size_t>(m_currentState.m_sourcePosition)].token)
                    {
                        ++m_currentState.m_sourcePosition;
                        m_currentState.m_stack.pop_back();
                    }
                    else
                    {
                        rollback();
                    }
                }
            }
            else // Store empty
            {

                rollback();
            }
        }
        else // End of source
        {
            if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                std::wcout << std::setw(10) << L"Source empty" << std::endl;
            if (m_currentState.m_stack.empty())
            {
                if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                    std::wcout << std::setw(10) << L"Parsing complete" << std::endl;
                return false;
            }
            else
            {
                if (m_states.empty())
                    raise(L"mismatch");
                else
                    rollback();
            }
        }
        debugLine();
        return true;
    }